

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_set_multiset_Test::~ObjectTest_basic_set_multiset_Test
          (ObjectTest_basic_set_multiset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_multiset) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::multiset<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<short>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<int>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<long>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<float>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<double>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::multiset<object>);
}